

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-coalesce.c
# Opt level: O2

int main(int argc,char **argv)

{
  Boolean BVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  MA_AccessIndex index [10];
  Integer handle [10];
  
  BVar1 = MA_init(1000,0,0x400);
  if (BVar1 != 0) {
    uVar2 = MA_inquire_heap(0x3e9);
    printf("MA_inquire_heap(MT_INT) = %d\n",uVar2 & 0xffffffff);
    puts("# Allocating 4 memory segments");
    uVar3 = (int)uVar2 >> 0x1f;
    lVar4 = (long)(int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / 5);
    MA_alloc_get(0x3e9,lVar4,"heap0",handle,index);
    MA_alloc_get(0x3e9,lVar4,"heap1",handle + 1,index + 1);
    MA_alloc_get(0x3e9,lVar4,"heap2",handle + 2,index + 2);
    MA_alloc_get(0x3e9,lVar4,"heap3",handle + 3,index + 3);
    puts("# Deleting 2 non-adjacent memory segments");
    MA_free_heap(handle[0]);
    MA_free_heap(handle[2]);
    puts("# Attempting to allocate memory segment -- should fail");
    lVar4 = (long)(int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / 4);
    MA_alloc_get(0x3e9,lVar4,"heap4",handle + 4,index + 4);
    puts("# Freeing some memory and trying again -- should succeed");
    MA_free_heap(handle[1]);
    MA_alloc_get(0x3e9,lVar4,"heap4",handle + 4,index + 4);
    puts("# Printing stats for allocated blocks -- should be two active");
    MA_summarize_allocated_blocks();
    return 0;
  }
  fwrite("MA_init failed; punting\n",0x18,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    Integer        bytes_heap;
    Integer        bytes_stack;
    int            howmany;
    Boolean        ok;
                  
    Integer        handle[MAXHANDLES];
    MA_AccessIndex index[MAXHANDLES];

    /* set sizes of heap and stack */
    bytes_heap = 1024;
    bytes_stack = 0;

    /* initialize */
    ok = MA_init(MT_CHAR, bytes_stack, bytes_heap);
    if (!ok)
    {
        (void)fprintf(stderr, "MA_init failed; punting\n");
        exit(1);
    }

    howmany = MA_inquire_heap(MT_INT);
    (void)printf("MA_inquire_heap(MT_INT) = %d\n", howmany);

    printf("# Allocating 4 memory segments\n");
    MA_alloc_get(MT_INT, howmany/5, "heap0", &handle[0], &index[0]);
    MA_alloc_get(MT_INT, howmany/5, "heap1", &handle[1], &index[1]);
    MA_alloc_get(MT_INT, howmany/5, "heap2", &handle[2], &index[2]);
    MA_alloc_get(MT_INT, howmany/5, "heap3", &handle[3], &index[3]);

    printf("# Deleting 2 non-adjacent memory segments\n");
    MA_free_heap(handle[0]);
    MA_free_heap(handle[2]);

    printf("# Attempting to allocate memory segment -- should fail\n");
    MA_alloc_get(MT_INT, howmany/4, "heap4", &handle[4], &index[4]);

    printf("# Freeing some memory and trying again -- should succeed\n");
    MA_free_heap(handle[1]);
    MA_alloc_get(MT_INT, howmany/4, "heap4", &handle[4], &index[4]);

    printf("# Printing stats for allocated blocks -- should be two active\n");
    MA_summarize_allocated_blocks();

    return 0;
}